

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::BuiltinType> __thiscall
mocker::Parser::builtinType(Parser *this,TokIter *iter,TokIter end)

{
  TokenID TVar1;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ast::BuiltinType> sVar3;
  anon_class_24_3_75efcddc mk;
  TokIter local_68;
  Token **ppTStack_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Token *local_38;
  undefined8 uStack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_68._M_current = in_RCX;
  TVar1 = GetTokenID::operator()((GetTokenID *)&local_68,*end._M_current);
  if (TVar1 - Void < 0xfffffffd) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    Token::position(*end._M_current);
    local_38 = local_68._M_current;
    uStack_30 = ppTStack_60;
    local_48 = local_58;
    uStack_40 = uStack_50;
    *(long *)end._M_current = *(long *)end._M_current + 0x38;
    local_68._M_current = (Token *)iter;
    ppTStack_60 = &local_38;
    local_58 = &local_48;
    sVar3 = builtinType::anon_class_24_3_75efcddc::operator()
                      ((anon_class_24_3_75efcddc *)this,(Type)&local_68);
    _Var2 = sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::BuiltinType>)
         sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::BuiltinType> Parser::builtinType(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end)(iter);
  if (id != TokenID::Bool && id != TokenID::Int && id != TokenID::String) {
    return nullptr;
  }

  Position posBeg, posEnd;
  std::tie(posBeg, posEnd) = iter->position();
  auto mk = [this, &posBeg, &posEnd](ast::BuiltinType::Type ty) {
    return makeNode<ast::BuiltinType>(posBeg, posEnd, ty);
  };

  ++iter;
  switch (id) {
  case TokenID::Bool:
    return mk(ast::BuiltinType::Bool);
  case TokenID::Int:
    return mk(ast::BuiltinType::Int);
  case TokenID::String:
    return mk(ast::BuiltinType::String);
  default:
    break;
  }
  assert(false);
}